

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result
spvc_resources_get_resource_list_for_type
          (spvc_resources resources,spvc_resource_type type,spvc_reflected_resource **resource_list,
          size_t *resource_size)

{
  spvc_context this;
  SmallVector<spvc_reflected_resource,_8UL> *pSVar1;
  spvc_result sVar2;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  pSVar1 = (SmallVector<spvc_reflected_resource,_8UL> *)0x0;
  switch(type) {
  case SPVC_RESOURCE_TYPE_UNIFORM_BUFFER:
    pSVar1 = &resources->uniform_buffers;
    break;
  case SPVC_RESOURCE_TYPE_STORAGE_BUFFER:
    pSVar1 = &resources->storage_buffers;
    break;
  case SPVC_RESOURCE_TYPE_STAGE_INPUT:
    pSVar1 = &resources->stage_inputs;
    break;
  case SPVC_RESOURCE_TYPE_STAGE_OUTPUT:
    pSVar1 = &resources->stage_outputs;
    break;
  case SPVC_RESOURCE_TYPE_SUBPASS_INPUT:
    pSVar1 = &resources->subpass_inputs;
    break;
  case SPVC_RESOURCE_TYPE_STORAGE_IMAGE:
    pSVar1 = &resources->storage_images;
    break;
  case SPVC_RESOURCE_TYPE_SAMPLED_IMAGE:
    pSVar1 = &resources->sampled_images;
    break;
  case SPVC_RESOURCE_TYPE_ATOMIC_COUNTER:
    pSVar1 = &resources->atomic_counters;
    break;
  case SPVC_RESOURCE_TYPE_PUSH_CONSTANT:
    pSVar1 = &resources->push_constant_buffers;
    break;
  case SPVC_RESOURCE_TYPE_SEPARATE_IMAGE:
    pSVar1 = &resources->separate_images;
    break;
  case SPVC_RESOURCE_TYPE_SEPARATE_SAMPLERS:
    pSVar1 = &resources->separate_samplers;
    break;
  case SPVC_RESOURCE_TYPE_ACCELERATION_STRUCTURE:
    pSVar1 = &resources->acceleration_structures;
    break;
  case SPVC_RESOURCE_TYPE_SHADER_RECORD_BUFFER:
    pSVar1 = &resources->shader_record_buffers;
    break;
  case SPVC_RESOURCE_TYPE_GL_PLAIN_UNIFORM:
    pSVar1 = &resources->gl_plain_uniforms;
  }
  if (pSVar1 == (SmallVector<spvc_reflected_resource,_8UL> *)0x0) {
    this = resources->context;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Invalid argument.","");
    std::__cxx11::string::operator=((string *)this,(string *)local_38);
    if (this->callback != (spvc_error_callback)0x0) {
      (*this->callback)(this->callback_userdata,(this->last_error)._M_dataplus._M_p);
    }
    sVar2 = SPVC_ERROR_INVALID_ARGUMENT;
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  else {
    *resource_size = (pSVar1->super_VectorView<spvc_reflected_resource>).buffer_size;
    *resource_list = (pSVar1->super_VectorView<spvc_reflected_resource>).ptr;
    sVar2 = SPVC_SUCCESS;
  }
  return sVar2;
}

Assistant:

spvc_result spvc_resources_get_resource_list_for_type(spvc_resources resources, spvc_resource_type type,
                                                      const spvc_reflected_resource **resource_list,
                                                      size_t *resource_size)
{
	const SmallVector<spvc_reflected_resource> *list = nullptr;
	switch (type)
	{
	case SPVC_RESOURCE_TYPE_UNIFORM_BUFFER:
		list = &resources->uniform_buffers;
		break;

	case SPVC_RESOURCE_TYPE_STORAGE_BUFFER:
		list = &resources->storage_buffers;
		break;

	case SPVC_RESOURCE_TYPE_STAGE_INPUT:
		list = &resources->stage_inputs;
		break;

	case SPVC_RESOURCE_TYPE_STAGE_OUTPUT:
		list = &resources->stage_outputs;
		break;

	case SPVC_RESOURCE_TYPE_SUBPASS_INPUT:
		list = &resources->subpass_inputs;
		break;

	case SPVC_RESOURCE_TYPE_STORAGE_IMAGE:
		list = &resources->storage_images;
		break;

	case SPVC_RESOURCE_TYPE_SAMPLED_IMAGE:
		list = &resources->sampled_images;
		break;

	case SPVC_RESOURCE_TYPE_ATOMIC_COUNTER:
		list = &resources->atomic_counters;
		break;

	case SPVC_RESOURCE_TYPE_PUSH_CONSTANT:
		list = &resources->push_constant_buffers;
		break;

	case SPVC_RESOURCE_TYPE_SEPARATE_IMAGE:
		list = &resources->separate_images;
		break;

	case SPVC_RESOURCE_TYPE_SEPARATE_SAMPLERS:
		list = &resources->separate_samplers;
		break;

	case SPVC_RESOURCE_TYPE_ACCELERATION_STRUCTURE:
		list = &resources->acceleration_structures;
		break;

	case SPVC_RESOURCE_TYPE_SHADER_RECORD_BUFFER:
		list = &resources->shader_record_buffers;
		break;

	case SPVC_RESOURCE_TYPE_GL_PLAIN_UNIFORM:
		list = &resources->gl_plain_uniforms;

	default:
		break;
	}

	if (!list)
	{
		resources->context->report_error("Invalid argument.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	*resource_size = list->size();
	*resource_list = list->data();
	return SPVC_SUCCESS;
}